

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_d_Test::~PhPacker_Arg_d_Test(PhPacker_Arg_d_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_d)
{
   std::string str = PhPacker::pack<double>('d', 1.234);
   double result = std::any_cast<double>(PhPacker::unpack('d', str));
   double expected = 1.234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<double>('d', 65232.123);
   result = std::any_cast<double>(PhPacker::unpack('d', str));
   expected = 65232.123;
   GTEST_ASSERT_EQ(result, expected);
}